

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  stbi_uc sVar8;
  byte bVar9;
  uchar uVar10;
  int iVar11;
  stbi__uint32 sVar12;
  uint uVar13;
  int iVar14;
  stbi__jpeg *psVar15;
  long lVar16;
  stbi__uint16 *data_00;
  stbi__context *psVar17;
  uchar *data_01;
  void *pvVar18;
  code *pcVar19;
  stbi__context *psVar20;
  float *data_02;
  stbi_uc *psVar21;
  uchar *puVar22;
  byte *pbVar23;
  long lVar24;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar25;
  uint uVar26;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int why;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar27;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  ulong extraout_RDX_12;
  ulong extraout_RDX_13;
  ulong extraout_RDX_14;
  ulong extraout_RDX_15;
  ulong uVar28;
  ulong uVar29;
  stbi_uc *psVar30;
  stbi_uc *psVar31;
  short *psVar32;
  long lVar33;
  undefined7 uVar34;
  int iVar35;
  int iVar36;
  undefined4 in_register_00000084;
  ulong uVar37;
  int iVar38;
  stbi__result_info *ri_00;
  ulong uVar39;
  int iVar40;
  int iVar41;
  stbi__uint16 *psVar42;
  stbi_uc (*pasVar43) [4];
  int *piVar44;
  short sVar45;
  uint uVar46;
  bool bVar47;
  undefined1 auVar48 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_8978;
  uint local_8960;
  ulong local_8948;
  int local_893c;
  uint local_8930;
  uint local_8924;
  uint local_890c;
  stbi__bmp_data local_8908;
  int *local_88e8;
  int *local_88e0;
  undefined8 local_88d8;
  uint local_88cc;
  stbi_uc *local_88c8;
  ulong local_88c0;
  stbi__uint32 local_88b4;
  uint local_88b0;
  int local_88ac;
  stbi__gif local_88a8;
  
  psVar31 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  local_88e8 = comp;
  psVar15 = (stbi__jpeg *)malloc(0x4888);
  psVar15->s = s;
  psVar15->idct_block_kernel = stbi__idct_simd;
  psVar15->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar15->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar15->jfif = 0;
  psVar15->app14_color_transform = -1;
  psVar15->marker = 0xff;
  sVar8 = stbi__get_marker(psVar15);
  if (sVar8 != 0xd8) {
    stbi__g_failure_reason = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar15);
  if (sVar8 == 0xd8) {
    psVar15 = (stbi__jpeg *)malloc(0x4888);
    psVar15->s = s;
    psVar15->idct_block_kernel = stbi__idct_simd;
    psVar15->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar15->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      paVar1 = psVar15->img_comp;
      lVar16 = 0x46d8;
      do {
        psVar31 = psVar15->huff_dc[0].fast + lVar16 + -8;
        psVar31[0] = '\0';
        psVar31[1] = '\0';
        psVar31[2] = '\0';
        psVar31[3] = '\0';
        psVar31[4] = '\0';
        psVar31[5] = '\0';
        psVar31[6] = '\0';
        psVar31[7] = '\0';
        psVar31[8] = '\0';
        psVar31[9] = '\0';
        psVar31[10] = '\0';
        psVar31[0xb] = '\0';
        psVar31[0xc] = '\0';
        psVar31[0xd] = '\0';
        psVar31[0xe] = '\0';
        psVar31[0xf] = '\0';
        lVar16 = lVar16 + 0x60;
      } while (lVar16 != 0x4858);
      psVar15->restart_interval = 0;
      iVar11 = stbi__decode_jpeg_header(psVar15,0);
      uVar46 = extraout_EDX;
      if (iVar11 != 0) {
        bVar9 = stbi__get_marker(psVar15);
        local_88e0 = psVar15->huff_ac[0].delta + 9;
LAB_001c727e:
        if (bVar9 == 0xda) {
          iVar11 = stbi__get16be(psVar15->s);
          psVar17 = psVar15->s;
          pbVar23 = psVar17->img_buffer;
          paVar27 = extraout_RDX_00;
          if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c735e:
            psVar17->img_buffer = pbVar23 + 1;
            bVar9 = *pbVar23;
          }
          else {
            if (psVar17->read_from_callbacks != 0) {
              psVar31 = psVar17->buffer_start;
              iVar41 = (*(psVar17->io).read)(psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
              if (iVar41 == 0) {
                psVar17->read_from_callbacks = 0;
                psVar17->img_buffer = psVar31;
                psVar17->img_buffer_end = psVar17->buffer_start + 1;
                psVar17->buffer_start[0] = '\0';
              }
              else {
                psVar17->img_buffer = psVar31;
                psVar17->img_buffer_end = psVar31 + iVar41;
              }
              pbVar23 = psVar17->img_buffer;
              paVar27 = extraout_RDX_01;
              goto LAB_001c735e;
            }
            bVar9 = 0;
          }
          psVar15->scan_n = (uint)bVar9;
          if ((0xfb < (byte)(bVar9 - 5)) && ((int)(uint)bVar9 <= psVar15->s->img_n)) {
            if (iVar11 != (uint)bVar9 * 2 + 6) {
              stbi__g_failure_reason = "bad SOS len";
              goto LAB_001c97cd;
            }
            if (bVar9 != 0) {
              lVar16 = 0;
              do {
                psVar17 = psVar15->s;
                pbVar23 = psVar17->img_buffer;
                if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c7419:
                  psVar17->img_buffer = pbVar23 + 1;
                  uVar25 = (uint)*pbVar23;
                }
                else {
                  if (psVar17->read_from_callbacks != 0) {
                    psVar31 = psVar17->buffer_start;
                    iVar11 = (*(psVar17->io).read)
                                       (psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
                    if (iVar11 == 0) {
                      psVar17->read_from_callbacks = 0;
                      psVar17->img_buffer = psVar31;
                      psVar17->img_buffer_end = psVar17->buffer_start + 1;
                      psVar17->buffer_start[0] = '\0';
                    }
                    else {
                      psVar17->img_buffer = psVar31;
                      psVar17->img_buffer_end = psVar31 + iVar11;
                    }
                    pbVar23 = psVar17->img_buffer;
                    goto LAB_001c7419;
                  }
                  uVar25 = 0;
                }
                psVar17 = psVar15->s;
                pbVar23 = psVar17->img_buffer;
                if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c7498:
                  psVar17->img_buffer = pbVar23 + 1;
                  bVar9 = *pbVar23;
                }
                else {
                  if (psVar17->read_from_callbacks != 0) {
                    psVar31 = psVar17->buffer_start;
                    iVar11 = (*(psVar17->io).read)
                                       (psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
                    if (iVar11 == 0) {
                      psVar17->read_from_callbacks = 0;
                      psVar17->img_buffer = psVar31;
                      psVar17->img_buffer_end = psVar17->buffer_start + 1;
                      psVar17->buffer_start[0] = '\0';
                    }
                    else {
                      psVar17->img_buffer = psVar31;
                      psVar17->img_buffer_end = psVar31 + iVar11;
                    }
                    pbVar23 = psVar17->img_buffer;
                    goto LAB_001c7498;
                  }
                  bVar9 = 0;
                }
                uVar46 = psVar15->s->img_n;
                if ((int)uVar46 < 1) {
                  uVar28 = 0;
                }
                else {
                  uVar28 = 0;
                  paVar27 = paVar1;
                  do {
                    if (paVar27->id == uVar25) goto LAB_001c74d0;
                    uVar28 = uVar28 + 1;
                    paVar27 = paVar27 + 1;
                  } while (uVar46 != uVar28);
                  uVar28 = (ulong)uVar46;
                }
LAB_001c74d0:
                if ((uint)uVar28 == uVar46) goto LAB_001c97d4;
                uVar29 = uVar28 & 0xffffffff;
                paVar27 = (anon_struct_96_18_0d0905d3 *)(uVar29 * 0x60);
                psVar15->img_comp[uVar29].hd = (uint)(bVar9 >> 4);
                if (0x3f < bVar9) {
                  stbi__g_failure_reason = "bad DC huff";
                  goto LAB_001c97cd;
                }
                paVar27 = paVar1 + uVar29;
                paVar27->ha = bVar9 & 0xf;
                if (3 < (bVar9 & 0xf)) {
                  stbi__g_failure_reason = "bad AC huff";
                  goto LAB_001c97cd;
                }
                psVar15->order[lVar16] = (uint)uVar28;
                lVar16 = lVar16 + 1;
              } while (lVar16 < psVar15->scan_n);
            }
            psVar17 = psVar15->s;
            pbVar23 = psVar17->img_buffer;
            if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c7596:
              psVar17->img_buffer = pbVar23 + 1;
              uVar46 = (uint)*pbVar23;
            }
            else {
              if (psVar17->read_from_callbacks != 0) {
                psVar31 = psVar17->buffer_start;
                iVar11 = (*(psVar17->io).read)
                                   (psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
                if (iVar11 == 0) {
                  psVar17->read_from_callbacks = 0;
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar17->buffer_start + 1;
                  psVar17->buffer_start[0] = '\0';
                }
                else {
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar31 + iVar11;
                }
                pbVar23 = psVar17->img_buffer;
                goto LAB_001c7596;
              }
              uVar46 = 0;
            }
            psVar15->spec_start = uVar46;
            psVar17 = psVar15->s;
            pbVar23 = psVar17->img_buffer;
            if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c761c:
              psVar17->img_buffer = pbVar23 + 1;
              uVar46 = (uint)*pbVar23;
            }
            else {
              if (psVar17->read_from_callbacks != 0) {
                psVar31 = psVar17->buffer_start;
                iVar11 = (*(psVar17->io).read)
                                   (psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
                if (iVar11 == 0) {
                  psVar17->read_from_callbacks = 0;
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar17->buffer_start + 1;
                  psVar17->buffer_start[0] = '\0';
                }
                else {
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar31 + iVar11;
                }
                pbVar23 = psVar17->img_buffer;
                goto LAB_001c761c;
              }
              uVar46 = 0;
            }
            psVar15->spec_end = uVar46;
            psVar17 = psVar15->s;
            pbVar23 = psVar17->img_buffer;
            if (pbVar23 < psVar17->img_buffer_end) {
LAB_001c76a2:
              psVar17->img_buffer = pbVar23 + 1;
              bVar9 = *pbVar23;
            }
            else {
              if (psVar17->read_from_callbacks != 0) {
                psVar31 = psVar17->buffer_start;
                iVar11 = (*(psVar17->io).read)
                                   (psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
                if (iVar11 == 0) {
                  psVar17->read_from_callbacks = 0;
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar17->buffer_start + 1;
                  psVar17->buffer_start[0] = '\0';
                }
                else {
                  psVar17->img_buffer = psVar31;
                  psVar17->img_buffer_end = psVar31 + iVar11;
                }
                pbVar23 = psVar17->img_buffer;
                goto LAB_001c76a2;
              }
              bVar9 = 0;
            }
            psVar15->succ_high = (uint)(bVar9 >> 4);
            uVar46 = bVar9 & 0xf;
            paVar27 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar46;
            psVar15->succ_low = uVar46;
            iVar11 = psVar15->progressive;
            iVar41 = psVar15->spec_start;
            if (iVar11 == 0) {
              if (((iVar41 != 0) || (0xf < bVar9)) || ((bVar9 & 0xf) != 0)) goto LAB_001c8d3b;
              psVar15->spec_end = 0x3f;
            }
            else if (((0x3f < iVar41) || (0x3f < psVar15->spec_end)) ||
                    ((psVar15->spec_end < iVar41 || ((0xdf < bVar9 || (0xd < uVar46)))))) {
LAB_001c8d3b:
              stbi__g_failure_reason = "bad SOS";
              goto LAB_001c97cd;
            }
            iVar41 = psVar15->scan_n;
            uVar28 = (ulong)(uint)psVar15->restart_interval;
            if (psVar15->restart_interval == 0) {
              uVar28 = 0x7fffffff;
            }
            psVar15->code_buffer = 0;
            psVar15->code_bits = 0;
            psVar15->nomore = 0;
            psVar15->img_comp[3].dc_pred = 0;
            psVar15->img_comp[2].dc_pred = 0;
            psVar15->img_comp[1].dc_pred = 0;
            psVar15->img_comp[0].dc_pred = 0;
            psVar15->marker = 0xff;
            uVar46 = (uint)uVar28;
            psVar15->todo = uVar46;
            psVar15->eob_run = 0;
            if (iVar11 == 0) {
              if (iVar41 == 1) {
                iVar41 = psVar15->order[0];
                uVar25 = psVar15->img_comp[iVar41].y + 7 >> 3;
                local_8948 = (ulong)uVar25;
                if (0 < (int)uVar25) {
                  uVar13 = paVar1[iVar41].x + 7 >> 3;
                  iVar38 = 0;
                  uVar26 = 0;
                  iVar11 = local_8978;
                  do {
                    if (0 < (int)uVar13) {
                      lVar16 = 0;
                      do {
                        iVar40 = stbi__jpeg_decode_block
                                           (psVar15,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar15->huff_dc[paVar1[iVar41].hd].fast,
                                            (stbi__huffman *)
                                            psVar15->huff_ac[paVar1[iVar41].ha].fast,
                                            psVar15->fast_ac[paVar1[iVar41].ha],iVar41,
                                            psVar15->dequant[paVar1[iVar41].tq]);
                        if (iVar40 == 0) {
                          bVar47 = false;
                          iVar11 = 0;
                          uVar28 = extraout_RDX_07;
                        }
                        else {
                          (*psVar15->idct_block_kernel)
                                    (paVar1[iVar41].data + lVar16 + iVar38 * paVar1[iVar41].w2,
                                     paVar1[iVar41].w2,(short *)&local_88a8);
                          iVar40 = psVar15->todo;
                          psVar15->todo = iVar40 + -1;
                          bVar47 = true;
                          uVar28 = extraout_RDX_08;
                          if (iVar40 < 2) {
                            if (psVar15->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar15);
                              uVar28 = extraout_RDX_09;
                            }
                            if ((psVar15->marker & 0xf8) == 0xd0) {
                              psVar15->code_buffer = 0;
                              psVar15->code_bits = 0;
                              psVar15->nomore = 0;
                              psVar15->img_comp[3].dc_pred = 0;
                              psVar15->img_comp[2].dc_pred = 0;
                              psVar15->img_comp[1].dc_pred = 0;
                              psVar15->img_comp[0].dc_pred = 0;
                              psVar15->marker = 0xff;
                              iVar40 = psVar15->restart_interval;
                              uVar28 = 0x7fffffff;
                              if (iVar40 == 0) {
                                iVar40 = 0x7fffffff;
                              }
                              psVar15->todo = iVar40;
                              psVar15->eob_run = 0;
                            }
                            else {
                              iVar11 = 1;
                              bVar47 = false;
                            }
                          }
                        }
                        uVar46 = (uint)uVar28;
                        local_8978 = iVar11;
                        if (!bVar47) goto LAB_001c8722;
                        lVar16 = lVar16 + 8;
                      } while ((ulong)uVar13 * 8 != lVar16);
                    }
                    uVar46 = (uint)uVar28;
                    uVar26 = uVar26 + 1;
                    iVar38 = iVar38 + 8;
                    local_8978 = iVar11;
                  } while (uVar26 != uVar25);
                }
LAB_001c84b3:
                iVar11 = 1;
              }
              else {
                iVar11 = 1;
                if (0 < psVar15->img_mcu_y) {
                  iVar41 = 0;
                  do {
                    if (0 < psVar15->img_mcu_x) {
                      local_8978 = 0;
                      do {
                        if (0 < psVar15->scan_n) {
                          uVar29 = 0;
                          do {
                            local_8948 = uVar29;
                            iVar11 = psVar15->order[local_8948];
                            if (0 < psVar15->img_comp[iVar11].v) {
                              iVar38 = 0;
                              bVar47 = true;
                              do {
                                iVar40 = paVar1[iVar11].h;
                                if (0 < iVar40) {
                                  iVar35 = 0;
                                  do {
                                    iVar36 = paVar1[iVar11].v;
                                    iVar14 = stbi__jpeg_decode_block
                                                       (psVar15,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar15->huff_dc[paVar1[iVar11].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar15->huff_ac[paVar1[iVar11].ha].fast,
                                                        psVar15->fast_ac[paVar1[iVar11].ha],iVar11,
                                                        psVar15->dequant[paVar1[iVar11].tq]);
                                    uVar46 = (uint)extraout_RDX_11;
                                    if (iVar14 == 0) {
                                      uVar28 = extraout_RDX_11;
                                      if (bVar47) goto LAB_001c870a;
                                      goto LAB_001c8617;
                                    }
                                    (*psVar15->idct_block_kernel)
                                              (paVar1[iVar11].data +
                                               (long)((iVar40 * local_8978 + iVar35) * 8) +
                                               (long)((iVar36 * iVar41 + iVar38) * paVar1[iVar11].w2
                                                     * 8),paVar1[iVar11].w2,(short *)&local_88a8);
                                    iVar35 = iVar35 + 1;
                                    iVar40 = paVar1[iVar11].h;
                                    uVar28 = extraout_RDX_12;
                                  } while (iVar35 < iVar40);
                                }
                                iVar38 = iVar38 + 1;
                                bVar47 = iVar38 < paVar1[iVar11].v;
                              } while (iVar38 < paVar1[iVar11].v);
                            }
LAB_001c8617:
                            uVar29 = local_8948 + 1;
                          } while ((long)(local_8948 + 1) < (long)psVar15->scan_n);
                        }
                        uVar46 = (uint)uVar28;
                        iVar38 = psVar15->todo;
                        psVar15->todo = iVar38 + -1;
                        iVar11 = 1;
                        if (iVar38 < 2) {
                          if (psVar15->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar15);
                            uVar46 = extraout_EDX_02;
                          }
                          if ((psVar15->marker & 0xf8) != 0xd0) goto LAB_001c8722;
                          psVar15->code_buffer = 0;
                          psVar15->code_bits = 0;
                          psVar15->nomore = 0;
                          psVar15->img_comp[3].dc_pred = 0;
                          psVar15->img_comp[2].dc_pred = 0;
                          psVar15->img_comp[1].dc_pred = 0;
                          psVar15->img_comp[0].dc_pred = 0;
                          psVar15->marker = 0xff;
                          iVar11 = psVar15->restart_interval;
                          uVar28 = 0x7fffffff;
                          if (iVar11 == 0) {
                            iVar11 = 0x7fffffff;
                          }
                          psVar15->todo = iVar11;
                          psVar15->eob_run = 0;
                        }
                        local_8978 = local_8978 + 1;
                      } while (local_8978 < psVar15->img_mcu_x);
                    }
                    uVar46 = (uint)uVar28;
                    iVar11 = 1;
                    iVar41 = iVar41 + 1;
                  } while (iVar41 < psVar15->img_mcu_y);
                }
              }
            }
            else if (iVar41 == 1) {
              local_88c0 = (ulong)psVar15->order[0];
              iVar41 = psVar15->img_comp[local_88c0].y + 7 >> 3;
              iVar11 = 1;
              if (0 < iVar41) {
                paVar27 = paVar1 + local_88c0;
                iVar38 = psVar15->img_comp[local_88c0].x + 7 >> 3;
                local_893c = 0;
                local_88d8 = paVar27;
                do {
                  if (0 < iVar38) {
                    iVar11 = 0;
                    do {
                      piVar44 = local_88e0;
                      psVar32 = paVar27->coeff + (paVar27->coeff_w * local_893c + iVar11) * 0x40;
                      uVar29 = (ulong)psVar15->spec_start;
                      if (uVar29 == 0) {
                        iVar40 = stbi__jpeg_decode_block_prog_dc
                                           (psVar15,psVar32,
                                            (stbi__huffman *)psVar15->huff_dc[paVar27->hd].fast,
                                            (int)local_88c0);
                        uVar28 = extraout_RDX_03;
                        if (iVar40 != 0) goto LAB_001c7d01;
                        bVar47 = false;
                        local_8948 = 0;
                      }
                      else {
                        lVar16 = (long)paVar27->ha;
                        local_8978 = psVar15->succ_low;
                        iVar40 = psVar15->eob_run;
                        bVar9 = (byte)local_8978;
                        if (psVar15->succ_high == 0) {
                          if (iVar40 == 0) {
                            do {
                              if (psVar15->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar15);
                              }
                              sVar45 = psVar15->fast_ac[lVar16][psVar15->code_buffer >> 0x17];
                              uVar46 = (uint)sVar45;
                              iVar40 = (int)uVar29;
                              if (sVar45 == 0) {
                                if (psVar15->code_bits < 0x10) {
                                  stbi__grow_buffer_unsafe(psVar15);
                                }
                                uVar46 = psVar15->code_buffer;
                                uVar39 = (ulong)uVar46;
                                uVar28 = (ulong)psVar15->huff_ac[lVar16].fast[uVar46 >> 0x17];
                                if (uVar28 == 0xff) {
                                  lVar24 = 0;
                                  do {
                                    lVar33 = lVar24;
                                    lVar24 = lVar33 + 1;
                                  } while ((uint)piVar44[lVar16 * 0x1a4 + lVar33 + -0x11] <=
                                           uVar46 >> 0x10);
                                  iVar35 = psVar15->code_bits;
                                  if (lVar24 == 8) {
                                    psVar15->code_bits = iVar35 + -0x10;
                                    uVar37 = 0xffffffff;
                                  }
                                  else {
                                    uVar37 = 0xffffffff;
                                    if ((int)(lVar33 + 10) <= iVar35) {
                                      iVar36 = (uVar46 >> (0x17U - (char)lVar24 & 0x1f) &
                                               stbi__bmask[lVar33 + 10]) +
                                               piVar44[lVar16 * 0x1a4 + lVar24];
                                      bVar2 = psVar15->huff_ac[lVar16].size[iVar36];
                                      if ((uVar46 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                          (uint)psVar15->huff_ac[lVar16].code[iVar36])
                                      goto LAB_001ca75a;
                                      uVar46 = uVar46 << ((byte)(lVar33 + 10) & 0x1f);
                                      uVar39 = (ulong)uVar46;
                                      psVar15->code_bits = (iVar35 - (int)lVar24) + -9;
                                      psVar15->code_buffer = uVar46;
                                      uVar37 = (ulong)psVar15->huff_ac[lVar16].values[iVar36];
                                    }
                                  }
                                }
                                else {
                                  bVar2 = psVar15->huff_ac[lVar16].size[uVar28];
                                  uVar37 = 0xffffffff;
                                  if ((int)(uint)bVar2 <= psVar15->code_bits) {
                                    uVar46 = uVar46 << (bVar2 & 0x1f);
                                    uVar39 = (ulong)uVar46;
                                    psVar15->code_buffer = uVar46;
                                    psVar15->code_bits = psVar15->code_bits - (uint)bVar2;
                                    uVar37 = (ulong)psVar15->huff_ac[lVar16].values[uVar28];
                                  }
                                }
                                uVar46 = (uint)uVar37;
                                if ((int)uVar46 < 0) {
                                  stbi__g_failure_reason = "bad huffman code";
                                  iVar40 = 1;
                                  uVar28 = 0;
                                }
                                else {
                                  uVar28 = uVar37 >> 4;
                                  uVar25 = uVar46 & 0xf;
                                  if ((uVar37 & 0xf) == 0) {
                                    if (uVar46 < 0xf0) {
                                      psVar15->eob_run = 1 << ((byte)uVar28 & 0x1f);
                                      if (0xf < uVar46) {
                                        if (psVar15->code_bits < (int)uVar28) {
                                          stbi__grow_buffer_unsafe(psVar15);
                                        }
                                        bVar2 = (byte)uVar28 & 0x1f;
                                        uVar25 = psVar15->code_buffer << bVar2 |
                                                 psVar15->code_buffer >> 0x20 - bVar2;
                                        uVar46 = stbi__bmask[uVar28];
                                        psVar15->code_buffer = ~uVar46 & uVar25;
                                        psVar15->code_bits = psVar15->code_bits - (int)uVar28;
                                        psVar15->eob_run = psVar15->eob_run + (uVar25 & uVar46);
                                      }
                                      psVar15->eob_run = psVar15->eob_run + -1;
                                      iVar40 = 2;
                                      uVar28 = 0;
                                      goto LAB_001c80f5;
                                    }
                                    uVar46 = iVar40 + 0x10;
                                  }
                                  else {
                                    bVar2 = ""[(long)iVar40 + uVar28];
                                    if (psVar15->code_bits < (int)uVar25) {
                                      stbi__grow_buffer_unsafe(psVar15);
                                    }
                                    uVar46 = psVar15->code_buffer;
                                    uVar26 = uVar46 << (sbyte)uVar25 |
                                             uVar46 >> 0x20 - (sbyte)uVar25;
                                    uVar13 = *(uint *)((long)stbi__bmask + (ulong)(uVar25 * 4));
                                    psVar15->code_buffer = ~uVar13 & uVar26;
                                    psVar15->code_bits = psVar15->code_bits - uVar25;
                                    iVar35 = 0;
                                    if (-1 < (int)uVar46) {
                                      iVar35 = *(int *)((long)stbi__jbias + (ulong)(uVar25 * 4));
                                    }
                                    uVar25 = (uVar26 & uVar13) + iVar35 << (bVar9 & 0x1f);
                                    uVar39 = (ulong)uVar25;
                                    uVar46 = (int)((long)iVar40 + uVar28) + 1;
                                    psVar32[bVar2] = (short)uVar25;
                                  }
                                  iVar40 = 0;
                                  uVar29 = (ulong)uVar46;
                                  uVar28 = CONCAT71((int7)(uVar39 >> 8),1);
                                }
                              }
                              else {
                                psVar15->code_buffer = psVar15->code_buffer << (sbyte)(uVar46 & 0xf)
                                ;
                                psVar15->code_bits = psVar15->code_bits - (uVar46 & 0xf);
                                lVar24 = (long)iVar40 + (ulong)(uVar46 >> 4 & 0xf);
                                uVar29 = (ulong)((int)lVar24 + 1);
                                psVar32[""[lVar24]] = (short)((uVar46 >> 8) << (bVar9 & 0x1f));
                                iVar40 = 0 << (bVar9 & 0x1f);
                                uVar28 = 1;
                              }
LAB_001c80f5:
                              bVar47 = false;
                              uVar39 = 1;
                              if (iVar40 != 0) {
                                if (iVar40 != 2) {
                                  uVar39 = uVar28;
                                }
                                break;
                              }
                            } while ((int)uVar29 <= psVar15->spec_end);
                          }
                          else {
                            psVar15->eob_run = iVar40 + -1;
                            bVar47 = true;
                            uVar39 = 0;
                          }
                          if ((char)uVar39 != '\0') goto LAB_001c7cd7;
                        }
                        else {
                          if (iVar40 == 0) {
                            uVar46 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                            do {
                              if (psVar15->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar15);
                              }
                              uVar25 = psVar15->code_buffer;
                              uVar28 = (ulong)uVar25;
                              uVar39 = (ulong)psVar15->huff_ac[lVar16].fast[uVar25 >> 0x17];
                              if (uVar39 == 0xff) {
                                lVar24 = 0;
                                do {
                                  lVar33 = lVar24;
                                  lVar24 = lVar33 + 1;
                                } while ((uint)piVar44[lVar16 * 0x1a4 + lVar33 + -0x11] <=
                                         uVar25 >> 0x10);
                                iVar40 = psVar15->code_bits;
                                if (lVar24 == 8) {
                                  psVar15->code_bits = iVar40 + -0x10;
                                  uVar37 = 0xffffffff;
                                }
                                else {
                                  uVar37 = 0xffffffff;
                                  if ((int)(lVar33 + 10) <= iVar40) {
                                    iVar35 = (uVar25 >> (0x17U - (char)lVar24 & 0x1f) &
                                             stbi__bmask[lVar33 + 10]) +
                                             piVar44[lVar16 * 0x1a4 + lVar24];
                                    bVar2 = psVar15->huff_ac[lVar16].size[iVar35];
                                    if ((uVar25 >> (-bVar2 & 0x1f) & stbi__bmask[bVar2]) !=
                                        (uint)psVar15->huff_ac[lVar16].code[iVar35]) {
LAB_001ca75a:
                                      __assert_fail(
                                                  "(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                                                  ,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/royalneverwin[P]Computer_graphics/third_party/stb/include/stb_image.h"
                                                  ,0x79d,
                                                  "int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)"
                                                  );
                                    }
                                    uVar25 = uVar25 << ((byte)(lVar33 + 10) & 0x1f);
                                    uVar28 = (ulong)uVar25;
                                    psVar15->code_bits = (iVar40 - (int)lVar24) + -9;
                                    psVar15->code_buffer = uVar25;
                                    uVar37 = (ulong)psVar15->huff_ac[lVar16].values[iVar35];
                                  }
                                }
                              }
                              else {
                                bVar2 = psVar15->huff_ac[lVar16].size[uVar39];
                                uVar37 = 0xffffffff;
                                if ((int)(uint)bVar2 <= psVar15->code_bits) {
                                  uVar25 = uVar25 << (bVar2 & 0x1f);
                                  uVar28 = (ulong)uVar25;
                                  psVar15->code_buffer = uVar25;
                                  psVar15->code_bits = psVar15->code_bits - (uint)bVar2;
                                  uVar37 = (ulong)psVar15->huff_ac[lVar16].values[uVar39];
                                }
                              }
                              uVar25 = (uint)uVar37;
                              if ((int)uVar25 < 0) {
                                stbi__g_failure_reason = "bad huffman code";
                                bVar47 = false;
                              }
                              else {
                                uVar39 = uVar37 >> 4;
                                if ((uVar25 & 0xf) == 1) {
                                  if (psVar15->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar15);
                                    uVar28 = extraout_RDX_04;
                                  }
                                  uVar25 = psVar15->code_buffer;
                                  psVar15->code_buffer = uVar25 * 2;
                                  psVar15->code_bits = psVar15->code_bits + -1;
                                  sVar45 = (short)(((int)~uVar25 >> 0x1f | 1U) << (bVar9 & 0x1f));
                                }
                                else {
                                  if ((uVar37 & 0xf) != 0) {
                                    stbi__g_failure_reason = "bad huffman code";
                                    bVar47 = false;
                                    goto LAB_001c7cc2;
                                  }
                                  if (uVar25 < 0xf0) {
                                    psVar15->eob_run = ~(-1 << ((byte)uVar39 & 0x1f));
                                    if (0xf < uVar25) {
                                      if (psVar15->code_bits < (int)uVar39) {
                                        stbi__grow_buffer_unsafe(psVar15);
                                      }
                                      bVar2 = (byte)uVar39 & 0x1f;
                                      uVar13 = psVar15->code_buffer << bVar2 |
                                               psVar15->code_buffer >> 0x20 - bVar2;
                                      uVar25 = stbi__bmask[uVar39];
                                      uVar26 = ~uVar25 & uVar13;
                                      uVar28 = (ulong)uVar26;
                                      psVar15->code_buffer = uVar26;
                                      psVar15->code_bits = psVar15->code_bits - (int)uVar39;
                                      psVar15->eob_run = psVar15->eob_run + (uVar13 & uVar25);
                                    }
                                    sVar45 = 0;
                                    uVar39 = 0x40;
                                  }
                                  else {
                                    sVar45 = 0;
                                    uVar39 = 0xf;
                                  }
                                }
                                uVar29 = (ulong)(int)uVar29;
                                do {
                                  if ((long)psVar15->spec_end < (long)uVar29) break;
                                  bVar2 = ""[uVar29];
                                  if (psVar32[bVar2] == 0) {
                                    if ((int)uVar39 == 0) {
                                      psVar32[bVar2] = sVar45;
                                      bVar47 = false;
                                      uVar39 = 0;
                                    }
                                    else {
                                      uVar39 = (ulong)((int)uVar39 - 1);
                                      bVar47 = true;
                                    }
                                  }
                                  else {
                                    if (psVar15->code_bits < 1) {
                                      stbi__grow_buffer_unsafe(psVar15);
                                      uVar28 = extraout_RDX_05;
                                    }
                                    sVar12 = psVar15->code_buffer;
                                    psVar15->code_buffer = sVar12 * 2;
                                    psVar15->code_bits = psVar15->code_bits + -1;
                                    bVar47 = true;
                                    if (((int)sVar12 < 0) &&
                                       (sVar3 = psVar32[bVar2], (uVar46 & (int)sVar3) == 0)) {
                                      uVar25 = uVar46;
                                      if (sVar3 < 1) {
                                        uVar25 = -uVar46;
                                      }
                                      psVar32[bVar2] = sVar3 + (short)uVar25;
                                    }
                                  }
                                  uVar29 = uVar29 + 1;
                                } while (bVar47);
                                bVar47 = true;
                              }
LAB_001c7cc2:
                              if (!bVar47) {
                                bVar47 = false;
                                goto LAB_001c7cdc;
                              }
                            } while ((int)uVar29 <= psVar15->spec_end);
                          }
                          else {
                            psVar15->eob_run = iVar40 + -1;
                            if (psVar15->spec_start <= psVar15->spec_end) {
                              uVar46 = (0x10000 << (bVar9 & 0x1f)) >> 0x10;
                              do {
                                bVar9 = ""[uVar29];
                                if (psVar32[bVar9] != 0) {
                                  if (psVar15->code_bits < 1) {
                                    stbi__grow_buffer_unsafe(psVar15);
                                    uVar28 = extraout_RDX_02;
                                  }
                                  sVar12 = psVar15->code_buffer;
                                  psVar15->code_buffer = sVar12 * 2;
                                  psVar15->code_bits = psVar15->code_bits + -1;
                                  if (((int)sVar12 < 0) &&
                                     (sVar45 = psVar32[bVar9], (uVar46 & (int)sVar45) == 0)) {
                                    uVar25 = -uVar46;
                                    if (0 < sVar45) {
                                      uVar25 = uVar46;
                                    }
                                    psVar32[bVar9] = (short)uVar25 + sVar45;
                                  }
                                }
                                bVar47 = (long)uVar29 < (long)psVar15->spec_end;
                                uVar29 = uVar29 + 1;
                              } while (bVar47);
                            }
                          }
LAB_001c7cd7:
                          bVar47 = true;
                        }
LAB_001c7cdc:
                        if (!bVar47) {
                          local_8948._0_4_ = 0;
                        }
                        local_8948 = (ulong)(uint)local_8948;
                        paVar27 = local_88d8;
                        if (!bVar47) {
                          bVar47 = false;
                        }
                        else {
LAB_001c7d01:
                          iVar40 = psVar15->todo;
                          psVar15->todo = iVar40 + -1;
                          bVar47 = true;
                          if (iVar40 < 2) {
                            if (psVar15->code_bits < 0x18) {
                              stbi__grow_buffer_unsafe(psVar15);
                              uVar28 = extraout_RDX_06;
                            }
                            if ((psVar15->marker & 0xf8) == 0xd0) {
                              psVar15->code_buffer = 0;
                              psVar15->code_bits = 0;
                              psVar15->nomore = 0;
                              psVar15->img_comp[3].dc_pred = 0;
                              psVar15->img_comp[2].dc_pred = 0;
                              psVar15->img_comp[1].dc_pred = 0;
                              psVar15->img_comp[0].dc_pred = 0;
                              psVar15->marker = 0xff;
                              iVar40 = psVar15->restart_interval;
                              uVar28 = 0x7fffffff;
                              if (iVar40 == 0) {
                                iVar40 = 0x7fffffff;
                              }
                              psVar15->todo = iVar40;
                              psVar15->eob_run = 0;
                            }
                            else {
                              local_8948 = 1;
                              bVar47 = false;
                            }
                          }
                        }
                      }
                      uVar46 = (uint)uVar28;
                      if (!bVar47) {
                        iVar11 = (int)local_8948;
                        goto LAB_001c8722;
                      }
                      iVar11 = iVar11 + 1;
                    } while (iVar11 != iVar38);
                  }
                  uVar46 = (uint)uVar28;
                  iVar11 = 1;
                  local_893c = local_893c + 1;
                } while (local_893c != iVar41);
              }
            }
            else {
              iVar11 = 1;
              if (0 < psVar15->img_mcu_y) {
                iVar11 = 0;
                do {
                  if (0 < psVar15->img_mcu_x) {
                    iVar41 = 0;
                    do {
                      if (0 < psVar15->scan_n) {
                        lVar16 = 0;
                        do {
                          iVar38 = psVar15->order[lVar16];
                          if (0 < psVar15->img_comp[iVar38].v) {
                            iVar40 = 0;
                            bVar47 = true;
                            do {
                              iVar35 = paVar1[iVar38].h;
                              if (0 < iVar35) {
                                iVar36 = 0;
                                do {
                                  iVar35 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar15,paVar1[iVar38].coeff +
                                                              (iVar35 * iVar41 + iVar36 +
                                                              (paVar1[iVar38].v * iVar11 + iVar40) *
                                                              paVar1[iVar38].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar15->huff_dc[paVar1[iVar38].hd].fast,
                                                      iVar38);
                                  uVar46 = (uint)extraout_RDX_10;
                                  uVar28 = extraout_RDX_10;
                                  if (iVar35 == 0) {
                                    if (bVar47) goto LAB_001c870a;
                                    goto LAB_001c83e6;
                                  }
                                  iVar36 = iVar36 + 1;
                                  iVar35 = paVar1[iVar38].h;
                                } while (iVar36 < iVar35);
                              }
                              iVar40 = iVar40 + 1;
                              bVar47 = iVar40 < paVar1[iVar38].v;
                            } while (iVar40 < paVar1[iVar38].v);
                          }
LAB_001c83e6:
                          lVar16 = lVar16 + 1;
                        } while (lVar16 < psVar15->scan_n);
                      }
                      uVar46 = (uint)uVar28;
                      iVar38 = psVar15->todo;
                      psVar15->todo = iVar38 + -1;
                      if (iVar38 < 2) {
                        if (psVar15->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar15);
                          uVar46 = extraout_EDX_01;
                        }
                        if ((psVar15->marker & 0xf8) != 0xd0) goto LAB_001c84b3;
                        psVar15->code_buffer = 0;
                        psVar15->code_bits = 0;
                        psVar15->nomore = 0;
                        psVar15->img_comp[3].dc_pred = 0;
                        psVar15->img_comp[2].dc_pred = 0;
                        psVar15->img_comp[1].dc_pred = 0;
                        psVar15->img_comp[0].dc_pred = 0;
                        psVar15->marker = 0xff;
                        iVar38 = psVar15->restart_interval;
                        uVar28 = 0x7fffffff;
                        if (iVar38 == 0) {
                          iVar38 = 0x7fffffff;
                        }
                        psVar15->todo = iVar38;
                        psVar15->eob_run = 0;
                      }
                      iVar41 = iVar41 + 1;
                    } while (iVar41 < psVar15->img_mcu_x);
                  }
                  uVar46 = (uint)uVar28;
                  iVar11 = iVar11 + 1;
                } while (iVar11 < psVar15->img_mcu_y);
                goto LAB_001c84b3;
              }
            }
            goto LAB_001c8722;
          }
          stbi__g_failure_reason = "bad SOS component count";
LAB_001c97cd:
          uVar46 = (uint)paVar27;
        }
        else {
          if (bVar9 == 0xdc) {
            iVar11 = stbi__get16be(psVar15->s);
            sVar12 = stbi__get16be(psVar15->s);
            paVar27 = extraout_RDX;
            if (iVar11 == 4) {
              if (sVar12 == psVar15->s->img_y) goto LAB_001c8734;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
            goto LAB_001c97cd;
          }
          if (bVar9 == 0xd9) {
            if ((psVar15->progressive != 0) && (0 < psVar15->s->img_n)) {
              lVar16 = 0;
              do {
                iVar11 = psVar15->img_comp[lVar16].y + 7 >> 3;
                if (0 < iVar11) {
                  uVar46 = paVar1[lVar16].x + 7 >> 3;
                  iVar41 = 0;
                  do {
                    if (0 < (int)uVar46) {
                      uVar28 = 0;
                      do {
                        psVar32 = paVar1[lVar16].coeff +
                                  (paVar1[lVar16].coeff_w * iVar41 + (int)uVar28) * 0x40;
                        iVar38 = paVar1[lVar16].tq;
                        lVar24 = 0;
                        do {
                          psVar32[lVar24] = psVar32[lVar24] * psVar15->dequant[iVar38][lVar24];
                          lVar24 = lVar24 + 1;
                        } while (lVar24 != 0x40);
                        (*psVar15->idct_block_kernel)
                                  (paVar1[lVar16].data +
                                   uVar28 * 8 + (long)(iVar41 * 8 * paVar1[lVar16].w2),
                                   paVar1[lVar16].w2,psVar32);
                        uVar28 = uVar28 + 1;
                      } while (uVar28 != uVar46);
                    }
                    iVar41 = iVar41 + 1;
                  } while (iVar41 != iVar11);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < psVar15->s->img_n);
            }
            if (req_comp == 0) {
              req_comp = (uint)(2 < psVar15->s->img_n) * 2 + 1;
            }
            uVar46 = psVar15->s->img_n;
            if (uVar46 == 3) {
              bVar47 = true;
              if (psVar15->rgb != 3) {
                if (psVar15->app14_color_transform != 0) goto LAB_001c8f57;
                bVar47 = psVar15->jfif == 0;
              }
            }
            else {
LAB_001c8f57:
              bVar47 = false;
            }
            uVar25 = 1;
            if (bVar47) {
              uVar25 = uVar46;
            }
            if (2 < req_comp) {
              uVar25 = uVar46;
            }
            if (uVar46 != 3) {
              uVar25 = uVar46;
            }
            if ((int)uVar25 < 1) {
LAB_001c90c4:
              psVar17 = psVar15->s;
              sVar12 = psVar17->img_y;
              psVar20 = (stbi__context *)stbi__malloc_mad3(req_comp,psVar17->img_x,sVar12,1);
              iVar11 = (int)extraout_RDX_13;
              if (psVar20 != (stbi__context *)0x0) {
                if (sVar12 != 0) {
                  iVar41 = 0;
                  uVar46 = 0;
                  uVar28 = extraout_RDX_13;
                  do {
                    sVar12 = psVar17->img_x;
                    if (0 < (int)uVar25) {
                      pasVar43 = (stbi_uc (*) [4])&local_88a8.ratio;
                      uVar29 = 0;
                      piVar44 = &psVar15->img_comp[0].y;
                      do {
                        asVar5 = pasVar43[-1];
                        asVar6 = pasVar43[-3];
                        iVar11 = (int)asVar6 >> 1;
                        auVar48 = (**(code **)(pasVar43 + -10))
                                            (*(stbi_uc **)(piVar44 + 10),
                                             *(undefined8 *)
                                              (*pasVar43 +
                                              ((ulong)(iVar11 <= (int)asVar5) << 3 |
                                              0xffffffffffffffe0)),
                                             *(undefined8 *)
                                              (*pasVar43 +
                                              ((ulong)((int)asVar5 < iVar11) << 3 |
                                              0xffffffffffffffe0)),pasVar43[-2]);
                        uVar28 = auVar48._8_8_;
                        *(long *)(&local_8908.bpp + uVar29 * 2) = auVar48._0_8_;
                        pasVar43[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar6 <= (int)asVar5 + 1) {
                          pasVar43[-1] = (stbi_uc  [4])0x0;
                          *(stbi_uc **)(pasVar43 + -8) = *(stbi_uc **)(pasVar43 + -6);
                          asVar5 = *pasVar43;
                          *pasVar43 = (stbi_uc  [4])((int)asVar5 + 1);
                          if ((int)asVar5 + 1 < *piVar44) {
                            *(stbi_uc **)(pasVar43 + -6) = *(stbi_uc **)(pasVar43 + -6) + piVar44[1]
                            ;
                          }
                        }
                        uVar29 = uVar29 + 1;
                        piVar44 = piVar44 + 0x18;
                        pasVar43 = pasVar43 + 0xc;
                      } while (uVar25 != uVar29);
                    }
                    if (req_comp < 3) {
                      psVar17 = psVar15->s;
                      if (bVar47) {
                        if (req_comp == 1) {
                          if (psVar17->img_x != 0) {
                            uVar28 = CONCAT44(local_8908.mr,local_8908.hsz);
                            uVar29 = 0;
                            do {
                              bVar9 = *(byte *)(CONCAT44(local_8908.mb,local_8908.mg) + uVar29);
                              psVar20->buffer_start[uVar29 + sVar12 * iVar41 + -0x38] =
                                   (stbi_uc)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                             (uint)*(byte *)(uVar28 + uVar29) * 0x96 +
                                             (uint)*(byte *)(CONCAT44(local_8908.offset,
                                                                      local_8908.bpp) + uVar29) *
                                             0x4d >> 8);
                              uVar29 = uVar29 + 1;
                            } while (uVar29 < psVar17->img_x);
                          }
                        }
                        else if (psVar17->img_x != 0) {
                          uVar28 = CONCAT44(local_8908.mr,local_8908.hsz);
                          uVar29 = 0;
                          do {
                            bVar9 = *(byte *)(CONCAT44(local_8908.mb,local_8908.mg) + uVar29);
                            psVar20->buffer_start[uVar29 * 2 + (ulong)(sVar12 * iVar41) + -0x38] =
                                 (stbi_uc)((uint)bVar9 * 2 + ((uint)bVar9 + (uint)bVar9 * 8) * 3 +
                                           (uint)*(byte *)(uVar28 + uVar29) * 0x96 +
                                           (uint)*(byte *)(CONCAT44(local_8908.offset,local_8908.bpp
                                                                   ) + uVar29) * 0x4d >> 8);
                            psVar20->buffer_start[uVar29 * 2 + (ulong)(sVar12 * iVar41) + -0x37] =
                                 0xff;
                            uVar29 = uVar29 + 1;
                          } while (uVar29 < psVar17->img_x);
                        }
                      }
                      else if (psVar17->img_n == 4) {
                        if (psVar15->app14_color_transform == 2) {
                          if (psVar17->img_x != 0) {
                            uVar28 = CONCAT44(local_8908.all_a,local_8908.ma);
                            psVar31 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x37);
                            uVar29 = 0;
                            do {
                              iVar11 = (*(byte *)(CONCAT44(local_8908.offset,local_8908.bpp) +
                                                 uVar29) ^ 0xff) * (uint)*(byte *)(uVar28 + uVar29);
                              psVar31[-1] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              *psVar31 = 0xff;
                              uVar29 = uVar29 + 1;
                              psVar31 = psVar31 + (uint)req_comp;
                            } while (uVar29 < psVar17->img_x);
                          }
                        }
                        else {
                          if (psVar15->app14_color_transform != 0) goto LAB_001c9506;
                          if (psVar17->img_x != 0) {
                            uVar28 = CONCAT44(local_8908.offset,local_8908.bpp);
                            psVar31 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x37);
                            uVar29 = 0;
                            do {
                              bVar9 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar29);
                              iVar38 = (uint)*(byte *)(uVar28 + uVar29) * (uint)bVar9;
                              iVar40 = (uint)*(byte *)(CONCAT44(local_8908.mr,local_8908.hsz) +
                                                      uVar29) * (uint)bVar9;
                              iVar11 = (uint)*(byte *)(CONCAT44(local_8908.mb,local_8908.mg) +
                                                      uVar29) * (uint)bVar9;
                              psVar31[-1] = (char)((iVar11 + (iVar11 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x1d +
                                                   (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x96 +
                                                   (iVar38 + (iVar38 + 0x80U >> 8) + 0x80 >> 8 &
                                                   0xff) * 0x4d >> 8);
                              *psVar31 = 0xff;
                              uVar29 = uVar29 + 1;
                              psVar31 = psVar31 + (uint)req_comp;
                            } while (uVar29 < psVar17->img_x);
                          }
                        }
                      }
                      else {
LAB_001c9506:
                        uVar13 = psVar17->img_x;
                        uVar28 = (ulong)uVar13;
                        if (req_comp == 1) {
                          if (uVar13 != 0) {
                            uVar28 = 0;
                            do {
                              psVar20->buffer_start[uVar28 + sVar12 * iVar41 + -0x38] =
                                   *(stbi_uc *)(CONCAT44(local_8908.offset,local_8908.bpp) + uVar28)
                              ;
                              uVar28 = uVar28 + 1;
                            } while (uVar28 < psVar17->img_x);
                          }
                        }
                        else if (uVar13 != 0) {
                          uVar28 = 0;
                          do {
                            psVar20->buffer_start[uVar28 * 2 + (ulong)(sVar12 * iVar41) + -0x38] =
                                 *(stbi_uc *)(CONCAT44(local_8908.offset,local_8908.bpp) + uVar28);
                            psVar20->buffer_start[uVar28 * 2 + (ulong)(sVar12 * iVar41) + -0x37] =
                                 0xff;
                            uVar28 = uVar28 + 1;
                          } while (uVar28 < psVar17->img_x);
                        }
                      }
                    }
                    else {
                      psVar31 = (stbi_uc *)CONCAT44(local_8908.offset,local_8908.bpp);
                      psVar17 = psVar15->s;
                      if (psVar17->img_n == 3) {
                        if (bVar47) {
                          if (psVar17->img_x != 0) {
                            uVar28 = CONCAT44(local_8908.mb,local_8908.mg);
                            psVar30 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x35);
                            uVar29 = 0;
                            do {
                              psVar30[-3] = psVar31[uVar29];
                              psVar30[-2] = *(undefined1 *)
                                             (CONCAT44(local_8908.mr,local_8908.hsz) + uVar29);
                              psVar30[-1] = *(undefined1 *)(uVar28 + uVar29);
                              *psVar30 = 0xff;
                              uVar29 = uVar29 + 1;
                              psVar30 = psVar30 + (uint)req_comp;
                            } while (uVar29 < psVar17->img_x);
                          }
                        }
                        else {
LAB_001c957b:
                          (*psVar15->YCbCr_to_RGB_kernel)
                                    (psVar20->buffer_start +
                                     ((ulong)(uVar46 * req_comp * sVar12) - 0x38),psVar31,
                                     (stbi_uc *)CONCAT44(local_8908.mr,local_8908.hsz),
                                     (stbi_uc *)CONCAT44(local_8908.mb,local_8908.mg),psVar17->img_x
                                     ,req_comp);
                          uVar28 = extraout_RDX_14;
                        }
                      }
                      else if (psVar17->img_n == 4) {
                        if (psVar15->app14_color_transform == 2) {
                          (*psVar15->YCbCr_to_RGB_kernel)
                                    (psVar20->buffer_start +
                                     ((ulong)(uVar46 * req_comp * sVar12) - 0x38),psVar31,
                                     (stbi_uc *)CONCAT44(local_8908.mr,local_8908.hsz),
                                     (stbi_uc *)CONCAT44(local_8908.mb,local_8908.mg),psVar17->img_x
                                     ,req_comp);
                          psVar17 = psVar15->s;
                          uVar28 = extraout_RDX_15;
                          if (psVar17->img_x != 0) {
                            psVar31 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x36);
                            uVar28 = 0;
                            do {
                              bVar9 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar28);
                              iVar11 = (psVar31[-2] ^ 0xff) * (uint)bVar9;
                              psVar31[-2] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              iVar11 = (psVar31[-1] ^ 0xff) * (uint)bVar9;
                              psVar31[-1] = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              iVar11 = (*psVar31 ^ 0xff) * (uint)bVar9;
                              *psVar31 = (byte)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              uVar28 = uVar28 + 1;
                              psVar31 = psVar31 + (uint)req_comp;
                            } while (uVar28 < psVar17->img_x);
                          }
                        }
                        else {
                          if (psVar15->app14_color_transform != 0) goto LAB_001c957b;
                          if (psVar17->img_x != 0) {
                            uVar28 = CONCAT44(local_8908.mr,local_8908.hsz);
                            psVar30 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x35);
                            uVar29 = 0;
                            do {
                              bVar9 = *(byte *)(CONCAT44(local_8908.all_a,local_8908.ma) + uVar29);
                              iVar11 = (uint)psVar31[uVar29] * (uint)bVar9;
                              psVar30[-3] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              iVar11 = (uint)*(byte *)(uVar28 + uVar29) * (uint)bVar9;
                              psVar30[-2] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              iVar11 = (uint)*(byte *)(CONCAT44(local_8908.mb,local_8908.mg) +
                                                      uVar29) * (uint)bVar9;
                              psVar30[-1] = (char)((iVar11 + 0x80U >> 8) + iVar11 + 0x80 >> 8);
                              *psVar30 = 0xff;
                              uVar29 = uVar29 + 1;
                              psVar30 = psVar30 + (uint)req_comp;
                            } while (uVar29 < psVar17->img_x);
                          }
                        }
                      }
                      else if (psVar17->img_x != 0) {
                        psVar30 = psVar20->buffer_start + ((ulong)(sVar12 * iVar41) - 0x35);
                        uVar29 = 0;
                        do {
                          sVar8 = psVar31[uVar29];
                          psVar30[-1] = sVar8;
                          psVar30[-2] = sVar8;
                          psVar30[-3] = sVar8;
                          *psVar30 = 0xff;
                          uVar29 = uVar29 + 1;
                          uVar28 = (ulong)psVar17->img_x;
                          psVar30 = psVar30 + (uint)req_comp;
                        } while (uVar29 < uVar28);
                      }
                    }
                    iVar11 = (int)uVar28;
                    uVar46 = uVar46 + 1;
                    psVar17 = psVar15->s;
                    iVar41 = iVar41 + req_comp;
                  } while (uVar46 < psVar17->img_y);
                }
                stbi__free_jpeg_components(psVar15,psVar17->img_n,iVar11);
                psVar17 = psVar15->s;
                *x = psVar17->img_x;
                *y = psVar17->img_y;
                if (local_88e8 != (int *)0x0) {
                  *local_88e8 = (uint)(2 < psVar17->img_n) * 2 + 1;
                }
                goto LAB_001c97e9;
              }
              stbi__free_jpeg_components(psVar15,psVar17->img_n,iVar11);
              stbi__g_failure_reason = "outofmem";
              goto LAB_001c97e3;
            }
            lVar16 = 0;
            while( true ) {
              psVar17 = psVar15->s;
              sVar12 = psVar17->img_x;
              pvVar18 = malloc((ulong)(sVar12 + 3));
              *(void **)((long)&psVar15->img_comp[0].linebuf + lVar16 * 2) = pvVar18;
              if (pvVar18 == (void *)0x0) {
                stbi__free_jpeg_components(psVar15,psVar17->img_n,why);
                stbi__g_failure_reason = "outofmem";
              }
              else {
                uVar28 = (long)psVar15->img_h_max /
                         (long)*(int *)((long)&psVar15->img_comp[0].h + lVar16 * 2);
                iVar11 = (int)uVar28;
                *(int *)((long)(local_88a8.pal + -7) + lVar16) = iVar11;
                iVar41 = psVar15->img_v_max / *(int *)((long)&psVar15->img_comp[0].v + lVar16 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar16) = iVar41;
                *(int *)((long)(local_88a8.pal + -4) + lVar16) = iVar41 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar16) =
                     (int)((ulong)((sVar12 + iVar11) - 1) / (uVar28 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar16) = 0;
                uVar7 = *(undefined8 *)((long)&psVar15->img_comp[0].data + lVar16 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar16) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar16) = uVar7;
                if ((iVar11 == 1) && (iVar41 == 1)) {
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar16) =
                       resample_row_1;
                }
                else {
                  if ((iVar11 == 1) && (iVar41 == 2)) {
                    pcVar19 = stbi__resample_row_v_2;
                  }
                  else if ((iVar11 == 2) && (iVar41 == 1)) {
                    pcVar19 = stbi__resample_row_h_2;
                  }
                  else if ((iVar11 == 2) && (iVar41 == 2)) {
                    pcVar19 = psVar15->resample_row_hv_2_kernel;
                  }
                  else {
                    pcVar19 = stbi__resample_row_generic;
                  }
                  *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar16) = pcVar19;
                }
              }
              psVar20 = (stbi__context *)0x0;
              if (pvVar18 == (void *)0x0) break;
              lVar16 = lVar16 + 0x30;
              if ((ulong)uVar25 * 0x30 == lVar16) goto LAB_001c90c4;
            }
            goto LAB_001c97e9;
          }
          iVar11 = stbi__process_marker(psVar15,(uint)bVar9);
          uVar46 = extraout_EDX_00;
          if (iVar11 != 0) goto LAB_001c8734;
        }
      }
LAB_001c97d4:
      stbi__free_jpeg_components(psVar15,psVar15->s->img_n,uVar46);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_001c97e3:
    psVar20 = (stbi__context *)0x0;
LAB_001c97e9:
    free(psVar15);
  }
  else {
    iVar11 = stbi__check_png_header(s);
    psVar30 = s->img_buffer_original;
    s->img_buffer = psVar30;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar11 != 0) {
      if ((uint)req_comp < 5) {
        local_88a8._0_8_ = s;
        iVar11 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
        data_00 = (stbi__uint16 *)local_88a8.history;
        uVar7 = local_88a8._0_8_;
        psVar42 = (stbi__uint16 *)0x0;
        if (iVar11 == 0) goto LAB_001c8a2c;
        iVar11 = 8;
        if (8 < local_88a8.flags) {
          iVar11 = local_88a8.flags;
        }
        ri->bits_per_channel = iVar11;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar11 = *(int *)(local_88a8._0_8_ + 0xc), iVar11 != req_comp)) {
          if (local_88a8.flags < 9) {
            data_00 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)data_00,iVar11,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            data_00 = stbi__convert_format16
                                (data_00,iVar11,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar7 + 0xc) = req_comp;
          if (data_00 == (stbi__uint16 *)0x0) goto LAB_001c71ea;
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar42 = data_00;
        if (local_88e8 != (int *)0x0) {
          *local_88e8 = *(int *)(local_88a8._0_8_ + 8);
        }
LAB_001c8a2c:
        free(local_88a8.history);
        local_88a8.history = (stbi_uc *)0x0;
        free(local_88a8.background);
        local_88a8.background = (stbi_uc *)0x0;
        free(local_88a8.out);
        return psVar42;
      }
      stbi__g_failure_reason = "bad req_comp";
      goto LAB_001c71ea;
    }
    if (psVar30 < s->img_buffer_original_end) {
LAB_001c897f:
      s->img_buffer = psVar30 + 1;
      if (*psVar30 != 'B') goto LAB_001c8bb9;
      psVar30 = s->img_buffer;
      if (s->img_buffer_end <= psVar30) {
        if (s->read_from_callbacks == 0) goto LAB_001c8bb9;
        psVar30 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar30;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar30;
          s->img_buffer_end = psVar30 + iVar11;
        }
        psVar30 = s->img_buffer;
      }
      s->img_buffer = psVar30 + 1;
      if (*psVar30 != 'M') goto LAB_001c8bb9;
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      stbi__get16le(s);
      uVar46 = stbi__get16le(s);
      iVar11 = stbi__get16le(s);
      uVar46 = iVar11 << 0x10 | uVar46;
      if ((((0x38 < uVar46) || ((0x100010000001000U >> ((ulong)uVar46 & 0x3f) & 1) == 0)) &&
          (uVar46 != 0x7c)) && (uVar46 != 0x6c)) goto LAB_001c8bb9;
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      local_8908.all_a = 0xff;
      pvVar18 = stbi__bmp_parse_header(s,&local_8908);
      if (pvVar18 == (void *)0x0) goto LAB_001c71ea;
      local_88b4 = s->img_y;
      sVar12 = -local_88b4;
      if (0 < (int)local_88b4) {
        sVar12 = local_88b4;
      }
      s->img_y = sVar12;
      if (local_8908.hsz == 0xc) {
        if (local_8908.bpp < 0x18) {
          uVar28 = (ulong)(uint)((local_8908.offset + -0x26) / 3);
        }
        else {
LAB_001c8d63:
          uVar28 = 0;
        }
      }
      else {
        if (0xf < local_8908.bpp) goto LAB_001c8d63;
        uVar28 = (ulong)(uint)((local_8908.offset - local_8908.hsz) + -0xe >> 2);
      }
      local_8930 = local_8908.all_a;
      iVar11 = 4 - (uint)(local_8908.ma == 0);
      s->img_n = iVar11;
      if (2 < req_comp) {
        iVar11 = req_comp;
      }
      sVar4 = s->img_x;
      iVar41 = stbi__mad3sizes_valid(iVar11,sVar4,sVar12,0);
      if (iVar41 == 0) {
        stbi__g_failure_reason = "too large";
      }
      else {
        data_01 = (uchar *)stbi__malloc_mad3(iVar11,sVar4,sVar12,0);
        if (data_01 == (uchar *)0x0) {
          stbi__g_failure_reason = "outofmem";
        }
        else {
          if (local_8908.bpp < 0x10) {
            iVar41 = (int)uVar28;
            if (0x100 < iVar41 || iVar41 == 0) {
              free(data_01);
              stbi__g_failure_reason = "invalid";
              goto LAB_001c71ea;
            }
            if (0 < iVar41) {
              psVar31 = s->buffer_start;
              psVar30 = s->buffer_start + 1;
              uVar29 = 0;
              do {
                psVar21 = s->img_buffer;
                if (psVar21 < s->img_buffer_end) {
LAB_001c9959:
                  s->img_buffer = psVar21 + 1;
                  sVar8 = *psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar30;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar31 + iVar38;
                    }
                    psVar21 = s->img_buffer;
                    goto LAB_001c9959;
                  }
                  sVar8 = '\0';
                }
                local_88a8.pal[uVar29 - 0xd][2] = sVar8;
                psVar21 = s->img_buffer;
                if (psVar21 < s->img_buffer_end) {
LAB_001c99d8:
                  s->img_buffer = psVar21 + 1;
                  sVar8 = *psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar30;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar31 + iVar38;
                    }
                    psVar21 = s->img_buffer;
                    goto LAB_001c99d8;
                  }
                  sVar8 = '\0';
                }
                local_88a8.pal[uVar29 - 0xd][1] = sVar8;
                psVar21 = s->img_buffer;
                if (psVar21 < s->img_buffer_end) {
LAB_001c9a57:
                  s->img_buffer = psVar21 + 1;
                  sVar8 = *psVar21;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar30;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar31 + iVar38;
                    }
                    psVar21 = s->img_buffer;
                    goto LAB_001c9a57;
                  }
                  sVar8 = '\0';
                }
                local_88a8.pal[uVar29 - 0xd][0] = sVar8;
                if (local_8908.hsz != 0xc) {
                  psVar21 = s->img_buffer;
                  if (s->img_buffer_end <= psVar21) {
                    if (s->read_from_callbacks == 0) goto LAB_001c9ae3;
                    iVar38 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                    if (iVar38 == 0) {
                      s->read_from_callbacks = 0;
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar30;
                      s->buffer_start[0] = '\0';
                    }
                    else {
                      s->img_buffer = psVar31;
                      s->img_buffer_end = psVar31 + iVar38;
                    }
                    psVar21 = s->img_buffer;
                  }
                  s->img_buffer = psVar21 + 1;
                }
LAB_001c9ae3:
                local_88a8.pal[uVar29 - 0xd][3] = 0xff;
                uVar29 = uVar29 + 1;
              } while (uVar28 != uVar29);
            }
            stbi__skip(s,(iVar41 * (local_8908.hsz == 0xc | 0xfffffffc) - local_8908.hsz) +
                         local_8908.offset + -0xe);
            if (local_8908.bpp == 8) {
              uVar46 = s->img_x;
            }
            else if (local_8908.bpp == 4) {
              uVar46 = s->img_x + 1 >> 1;
            }
            else {
              if (local_8908.bpp != 1) {
                free(data_01);
                stbi__g_failure_reason = "bad bpp";
                goto LAB_001c71ea;
              }
              uVar46 = s->img_x + 7 >> 3;
            }
            if (local_8908.bpp == 1) {
              if (0 < (int)s->img_y) {
                local_8960 = -uVar46 & 3;
                psVar31 = s->buffer_start;
                iVar41 = 0;
                iVar38 = 0;
                do {
                  pbVar23 = s->img_buffer;
                  if (pbVar23 < s->img_buffer_end) {
LAB_001ca3b4:
                    s->img_buffer = pbVar23 + 1;
                    uVar46 = (uint)*pbVar23;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                      if (iVar40 == 0) {
                        s->read_from_callbacks = 0;
                        s->img_buffer = psVar31;
                        s->img_buffer_end = s->buffer_start + 1;
                        s->buffer_start[0] = '\0';
                      }
                      else {
                        s->img_buffer = psVar31;
                        s->img_buffer_end = psVar31 + iVar40;
                      }
                      pbVar23 = s->img_buffer;
                      goto LAB_001ca3b4;
                    }
                    uVar46 = 0;
                  }
                  uVar25 = 7;
                  sVar12 = 1;
                  do {
                    sVar4 = s->img_x;
                    if ((int)sVar4 <= (int)(sVar12 - 1)) break;
                    uVar28 = (ulong)((uVar46 >> (uVar25 & 0x1f) & 1) != 0);
                    data_01[iVar41] = local_88a8.pal[uVar28 - 0xd][0];
                    data_01[(long)iVar41 + 1] = local_88a8.pal[uVar28 - 0xd][1];
                    data_01[(long)iVar41 + 2] = local_88a8.pal[uVar28 - 0xd][2];
                    iVar40 = iVar41 + 3;
                    if (iVar11 == 4) {
                      data_01[(long)iVar41 + 3] = 0xff;
                      iVar40 = iVar41 + 4;
                    }
                    iVar41 = iVar40;
                    if (sVar12 != sVar4) {
                      if ((int)uVar25 < 1) {
                        pbVar23 = s->img_buffer;
                        if (pbVar23 < s->img_buffer_end) {
LAB_001ca4ba:
                          s->img_buffer = pbVar23 + 1;
                          uVar46 = (uint)*pbVar23;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                            if (iVar40 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar31;
                              s->img_buffer_end = s->buffer_start + 1;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar31;
                              s->img_buffer_end = psVar31 + iVar40;
                            }
                            pbVar23 = s->img_buffer;
                            goto LAB_001ca4ba;
                          }
                          uVar46 = 0;
                        }
                        uVar25 = 7;
                      }
                      else {
                        uVar25 = uVar25 - 1;
                      }
                    }
                    bVar47 = sVar12 != sVar4;
                    sVar12 = sVar12 + 1;
                  } while (bVar47);
                  stbi__skip(s,local_8960);
                  iVar38 = iVar38 + 1;
                } while (iVar38 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              psVar31 = s->buffer_start;
              uVar28 = 0;
              iVar41 = 0;
              local_8960 = -uVar46 & 3;
              do {
                if (0 < (int)s->img_x) {
                  iVar38 = 0;
                  do {
                    iVar40 = (int)uVar28;
                    pbVar23 = s->img_buffer;
                    if (pbVar23 < s->img_buffer_end) {
LAB_001ca5b5:
                      s->img_buffer = pbVar23 + 1;
                      uVar46 = (uint)*pbVar23;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        iVar35 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                        if (iVar35 == 0) {
                          s->read_from_callbacks = 0;
                          s->img_buffer = psVar31;
                          s->img_buffer_end = s->buffer_start + 1;
                          s->buffer_start[0] = '\0';
                        }
                        else {
                          s->img_buffer = psVar31;
                          s->img_buffer_end = psVar31 + iVar35;
                        }
                        pbVar23 = s->img_buffer;
                        goto LAB_001ca5b5;
                      }
                      uVar46 = 0;
                    }
                    uVar25 = uVar46 >> 4;
                    if (local_8908.bpp != 4) {
                      uVar25 = uVar46;
                    }
                    uVar28 = (ulong)uVar25;
                    uVar46 = uVar46 & 0xf;
                    if (local_8908.bpp != 4) {
                      uVar46 = 0;
                    }
                    uVar25 = iVar40 + 3;
                    data_01[iVar40] = local_88a8.pal[uVar28 - 0xd][0];
                    data_01[(long)iVar40 + 1] = local_88a8.pal[uVar28 - 0xd][1];
                    data_01[(long)iVar40 + 2] = local_88a8.pal[uVar28 - 0xd][2];
                    if (iVar11 == 4) {
                      uVar25 = iVar40 + 4;
                      data_01[(long)iVar40 + 3] = 0xff;
                    }
                    sVar12 = s->img_x;
                    if (iVar38 + 1U == sVar12) {
LAB_001ca6f8:
                      uVar28 = (ulong)uVar25;
                    }
                    else {
                      if (local_8908.bpp == 8) {
                        pbVar23 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar23) {
                          if (s->read_from_callbacks == 0) {
                            uVar46 = 0;
                            goto LAB_001ca6b4;
                          }
                          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                          if (iVar40 == 0) {
                            s->read_from_callbacks = 0;
                            s->img_buffer = psVar31;
                            s->img_buffer_end = s->buffer_start + 1;
                            s->buffer_start[0] = '\0';
                          }
                          else {
                            s->img_buffer = psVar31;
                            s->img_buffer_end = psVar31 + iVar40;
                          }
                          pbVar23 = s->img_buffer;
                        }
                        s->img_buffer = pbVar23 + 1;
                        uVar46 = (uint)*pbVar23;
                      }
LAB_001ca6b4:
                      lVar16 = (long)(int)uVar25;
                      uVar28 = lVar16 + 3;
                      uVar29 = (ulong)uVar46;
                      data_01[lVar16] = local_88a8.pal[uVar29 - 0xd][0];
                      data_01[lVar16 + 1] = local_88a8.pal[uVar29 - 0xd][1];
                      data_01[lVar16 + 2] = local_88a8.pal[uVar29 - 0xd][2];
                      if (iVar11 == 4) {
                        uVar25 = uVar25 + 4;
                        data_01[lVar16 + 3] = 0xff;
                        goto LAB_001ca6f8;
                      }
                    }
                  } while ((iVar38 + 1U != sVar12) && (iVar38 = iVar38 + 2, iVar38 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_8960);
                iVar41 = iVar41 + 1;
              } while (iVar41 < (int)s->img_y);
            }
          }
          else {
            psVar17 = s;
            stbi__skip(s,(local_8908.offset - local_8908.hsz) + -0xe);
            if (local_8908.bpp == 0x18) {
              iVar41 = -3;
LAB_001c9ba5:
              local_88b0 = iVar41 * s->img_x & 3;
            }
            else {
              local_88b0 = 0;
              if (local_8908.bpp == 0x10) {
                iVar41 = -2;
                goto LAB_001c9ba5;
              }
            }
            iVar41 = 0;
            if (local_8908.bpp == 0x18) {
              uVar28 = 0;
LAB_001c9bfe:
              local_88d8 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88d8._4_4_ << 0x20);
            }
            else {
              uVar34 = (undefined7)((ulong)psVar17 >> 8);
              if (local_8908.bpp != 0x20) {
                uVar28 = CONCAT71(uVar34,1);
                goto LAB_001c9bfe;
              }
              uVar46 = local_8908.mr ^ 0xff0000 | local_8908.mg ^ 0xff00 | local_8908.mb ^ 0xff;
              local_88d8 = (anon_struct_96_18_0d0905d3 *)
                           CONCAT44(local_88d8._4_4_,
                                    CONCAT31((int3)(uVar46 >> 8),
                                             local_8908.ma == 0xff000000 && uVar46 == 0));
              uVar28 = CONCAT71(uVar34,local_8908.ma != 0xff000000 || uVar46 != 0);
            }
            iVar38 = 0;
            local_893c = 0;
            local_88c0 = local_88c0 & 0xffffffff00000000;
            uVar46 = 0;
            uVar25 = 0;
            local_8924 = 0;
            local_890c = 0;
            local_88cc = (uint)uVar28;
            if ((char)uVar28 == '\0') {
LAB_001c9e01:
              bVar47 = true;
              if (0 < (int)s->img_y) {
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,local_8908.mr);
                psVar31 = s->buffer_start;
                local_88c8 = s->buffer_start + 1;
                iVar35 = 0;
                iVar40 = 0;
                do {
                  local_88ac = iVar40;
                  if ((char)uVar28 == '\0') {
                    if (0 < (int)s->img_x) {
                      iVar40 = 0;
                      do {
                        puVar22 = s->img_buffer;
                        if (puVar22 < s->img_buffer_end) {
LAB_001c9fa7:
                          s->img_buffer = puVar22 + 1;
                          uVar10 = *puVar22;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar36 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                            if (iVar36 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar31;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar31;
                              s->img_buffer_end = psVar31 + iVar36;
                            }
                            puVar22 = s->img_buffer;
                            goto LAB_001c9fa7;
                          }
                          uVar10 = '\0';
                        }
                        data_01[(long)iVar35 + 2] = uVar10;
                        puVar22 = s->img_buffer;
                        if (puVar22 < s->img_buffer_end) {
LAB_001ca033:
                          s->img_buffer = puVar22 + 1;
                          uVar10 = *puVar22;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar36 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                            if (iVar36 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar31;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar31;
                              s->img_buffer_end = psVar31 + iVar36;
                            }
                            puVar22 = s->img_buffer;
                            goto LAB_001ca033;
                          }
                          uVar10 = '\0';
                        }
                        data_01[(long)iVar35 + 1] = uVar10;
                        puVar22 = s->img_buffer;
                        if (puVar22 < s->img_buffer_end) {
LAB_001ca0bc:
                          s->img_buffer = puVar22 + 1;
                          uVar10 = *puVar22;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            iVar36 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                            if (iVar36 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar31;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar31;
                              s->img_buffer_end = psVar31 + iVar36;
                            }
                            puVar22 = s->img_buffer;
                            goto LAB_001ca0bc;
                          }
                          uVar10 = '\0';
                        }
                        data_01[iVar35] = uVar10;
                        bVar9 = 0xff;
                        if ((char)local_88d8 != '\0') {
                          pbVar23 = s->img_buffer;
                          if (s->img_buffer_end <= pbVar23) {
                            if (s->read_from_callbacks == 0) {
                              bVar9 = 0;
                              goto LAB_001ca161;
                            }
                            iVar36 = (*(s->io).read)(s->io_user_data,(char *)psVar31,s->buflen);
                            if (iVar36 == 0) {
                              s->read_from_callbacks = 0;
                              s->img_buffer = psVar31;
                              s->img_buffer_end = local_88c8;
                              s->buffer_start[0] = '\0';
                            }
                            else {
                              s->img_buffer = psVar31;
                              s->img_buffer_end = psVar31 + iVar36;
                            }
                            pbVar23 = s->img_buffer;
                          }
                          s->img_buffer = pbVar23 + 1;
                          bVar9 = *pbVar23;
                        }
LAB_001ca161:
                        iVar36 = iVar35 + 3;
                        if (iVar11 == 4) {
                          data_01[(long)iVar35 + 3] = bVar9;
                          iVar36 = iVar35 + 4;
                        }
                        iVar35 = iVar36;
                        local_8930 = local_8930 | bVar9;
                        iVar40 = iVar40 + 1;
                      } while (iVar40 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar40 = 0;
                    do {
                      uVar13 = stbi__get16le(s);
                      if (local_8908.bpp != 0x10) {
                        iVar36 = stbi__get16le(s);
                        uVar13 = uVar13 | iVar36 << 0x10;
                      }
                      iVar36 = stbi__shiftsigned(uVar13 & (uint)local_88e0,iVar41,uVar46);
                      data_01[iVar35] = (uchar)iVar36;
                      iVar36 = stbi__shiftsigned(uVar13 & local_8908.mg,iVar38,uVar25);
                      data_01[(long)iVar35 + 1] = (uchar)iVar36;
                      iVar36 = stbi__shiftsigned(uVar13 & local_8908.mb,local_893c,local_8924);
                      data_01[(long)iVar35 + 2] = (uchar)iVar36;
                      if (local_8908.ma == 0) {
                        uVar13 = 0xff;
                      }
                      else {
                        uVar13 = stbi__shiftsigned(uVar13 & local_8908.ma,(int)local_88c0,local_890c
                                                  );
                      }
                      iVar36 = iVar35 + 3;
                      if (iVar11 == 4) {
                        data_01[(long)iVar35 + 3] = (uchar)uVar13;
                        iVar36 = iVar35 + 4;
                      }
                      iVar35 = iVar36;
                      local_8930 = local_8930 | uVar13;
                      iVar40 = iVar40 + 1;
                    } while (iVar40 < (int)s->img_x);
                  }
                  stbi__skip(s,local_88b0);
                  iVar40 = local_88ac + 1;
                  uVar28 = (ulong)local_88cc;
                } while (iVar40 < (int)s->img_y);
                bVar47 = true;
              }
            }
            else {
              if ((local_8908.mg != 0 && local_8908.mr != 0) && local_8908.mb != 0) {
                iVar41 = stbi__high_bit(local_8908.mr);
                iVar41 = iVar41 + -7;
                uVar46 = (local_8908.mr >> 1 & 0x55555555) + (local_8908.mr & 0x55555555);
                uVar46 = (uVar46 >> 2 & 0x33333333) + (uVar46 & 0x33333333);
                uVar46 = (uVar46 >> 4) + uVar46 & 0xf0f0f0f;
                uVar46 = (uVar46 >> 8) + uVar46;
                local_88e0 = (int *)CONCAT44(local_88e0._4_4_,local_8908.mr);
                uVar46 = (uVar46 >> 0x10) + uVar46 & 0xff;
                iVar38 = stbi__high_bit(local_8908.mg);
                iVar38 = iVar38 + -7;
                uVar25 = (local_8908.mg >> 1 & 0x55555555) + (local_8908.mg & 0x55555555);
                uVar25 = (uVar25 >> 2 & 0x33333333) + (uVar25 & 0x33333333);
                uVar25 = (uVar25 >> 4) + uVar25 & 0xf0f0f0f;
                uVar25 = (uVar25 >> 8) + uVar25;
                uVar25 = (uVar25 >> 0x10) + uVar25 & 0xff;
                local_893c = stbi__high_bit(local_8908.mb);
                local_893c = local_893c + -7;
                uVar13 = (local_8908.mb >> 1 & 0x55555555) + (local_8908.mb & 0x55555555);
                uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
                uVar13 = (uVar13 >> 4) + uVar13 & 0xf0f0f0f;
                uVar13 = (uVar13 >> 8) + uVar13;
                local_8924 = (uVar13 >> 0x10) + uVar13 & 0xff;
                iVar40 = stbi__high_bit(local_8908.ma);
                uVar28 = (ulong)local_88cc;
                local_88c0 = CONCAT44(local_88c0._4_4_,iVar40 + -7);
                uVar13 = (local_8908.ma >> 1 & 0x55555555) + (local_8908.ma & 0x55555555);
                uVar13 = (uVar13 >> 2 & 0x33333333) + (uVar13 & 0x33333333);
                uVar13 = (uVar13 >> 4) + uVar13 & 0xf0f0f0f;
                uVar13 = (uVar13 >> 8) + uVar13;
                local_890c = (uVar13 >> 0x10) + uVar13 & 0xff;
                local_8908.mr = (uint)local_88e0;
                goto LAB_001c9e01;
              }
              free(data_01);
              stbi__g_failure_reason = "bad masks";
              bVar47 = false;
            }
            if (!bVar47) goto LAB_001c71ea;
          }
          piVar44 = local_88e8;
          if (((iVar11 == 4) && (local_8930 == 0)) &&
             (iVar41 = s->img_x * s->img_y * 4, -1 < iVar41 + -1)) {
            lVar16 = (ulong)(iVar41 - 4) + 7;
            do {
              data_01[lVar16 + -4] = 0xff;
              lVar16 = lVar16 + -4;
            } while (3 < lVar16);
          }
          if (0 < (int)local_88b4) {
            uVar46 = (int)s->img_y >> 1;
            if (0 < (int)uVar46) {
              uVar13 = s->img_x * iVar11;
              uVar25 = (s->img_y - 1) * uVar13;
              uVar28 = 0;
              uVar29 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar39 = 0;
                  do {
                    uVar10 = data_01[uVar39 + uVar28];
                    data_01[uVar39 + uVar28] = data_01[uVar39 + uVar25];
                    data_01[uVar39 + uVar25] = uVar10;
                    uVar39 = uVar39 + 1;
                  } while (uVar13 != uVar39);
                }
                uVar29 = uVar29 + 1;
                uVar25 = uVar25 - uVar13;
                uVar28 = (ulong)((int)uVar28 + uVar13);
              } while (uVar29 != uVar46);
            }
          }
          if (((req_comp == 0) || (iVar11 == req_comp)) ||
             (data_01 = stbi__convert_format(data_01,iVar11,req_comp,s->img_x,s->img_y),
             data_01 != (uchar *)0x0)) {
            *x = s->img_x;
            *y = s->img_y;
            if (piVar44 == (int *)0x0) {
              return data_01;
            }
            *piVar44 = s->img_n;
            return data_01;
          }
        }
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        psVar30 = s->buffer_start;
        iVar11 = (*(s->io).read)(s->io_user_data,(char *)psVar30,s->buflen);
        if (iVar11 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar30;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar30;
          s->img_buffer_end = psVar30 + iVar11;
        }
        psVar30 = s->img_buffer;
        goto LAB_001c897f;
      }
LAB_001c8bb9:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      iVar11 = stbi__gif_test(s);
      if (iVar11 != 0) {
        memset(&local_88a8,0,0x8870);
        psVar17 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,local_88e8,0,psVar31);
        if (psVar17 == s) {
          psVar17 = (stbi__context *)0x0;
        }
        psVar20 = (stbi__context *)0x0;
        if (psVar17 != (stbi__context *)0x0) {
          *x = local_88a8.w;
          *y = local_88a8.h;
          psVar20 = psVar17;
          if ((req_comp & 0xfffffffbU) != 0) {
            psVar20 = (stbi__context *)
                      stbi__convert_format((uchar *)psVar17,4,req_comp,local_88a8.w,local_88a8.h);
          }
        }
        free(local_88a8.history);
        psVar15 = (stbi__jpeg *)local_88a8.background;
        goto LAB_001c97e9;
      }
      iVar11 = stbi__psd_test(s);
      if (iVar11 != 0) {
        pvVar18 = stbi__psd_load(s,x,y,local_88e8,req_comp,ri,bpc);
        return pvVar18;
      }
      iVar11 = stbi__pic_test(s);
      piVar44 = local_88e8;
      if (iVar11 != 0) {
        pvVar18 = stbi__pic_load(s,x,y,local_88e8,req_comp,ri_00);
        return pvVar18;
      }
      iVar11 = stbi__pnm_test(s);
      if (iVar11 != 0) {
        pvVar18 = stbi__pnm_load(s,x,y,piVar44,req_comp,ri_00);
        return pvVar18;
      }
      iVar11 = stbi__hdr_test(s);
      if (iVar11 != 0) {
        data_02 = stbi__hdr_load(s,x,y,piVar44,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *piVar44;
        }
        psVar31 = stbi__hdr_to_ldr(data_02,*x,*y,req_comp);
        return psVar31;
      }
      iVar11 = stbi__tga_test(s);
      if (iVar11 != 0) {
        pvVar18 = stbi__tga_load(s,x,y,piVar44,req_comp,ri_00);
        return pvVar18;
      }
      stbi__g_failure_reason = "unknown image type";
    }
LAB_001c71ea:
    psVar20 = (stbi__context *)0x0;
  }
  return psVar20;
LAB_001c870a:
  iVar11 = 0;
LAB_001c8722:
  if (iVar11 == 0) goto LAB_001c97d4;
  if (psVar15->marker != 0xff) goto LAB_001c8734;
LAB_001c8741:
  do {
    psVar17 = psVar15->s;
    if ((psVar17->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_001c875d:
      if (psVar17->img_buffer_end <= psVar17->img_buffer) goto LAB_001c8734;
    }
    else {
      iVar11 = (*(psVar17->io).eof)(psVar17->io_user_data);
      if (iVar11 != 0) {
        if (psVar17->read_from_callbacks != 0) goto LAB_001c875d;
        goto LAB_001c8734;
      }
    }
    psVar17 = psVar15->s;
    psVar31 = psVar17->img_buffer;
    if (psVar17->img_buffer_end <= psVar31) {
      if (psVar17->read_from_callbacks == 0) goto LAB_001c8741;
      psVar31 = psVar17->buffer_start;
      iVar11 = (*(psVar17->io).read)(psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
      if (iVar11 == 0) {
        psVar17->read_from_callbacks = 0;
        psVar17->img_buffer = psVar31;
        psVar17->img_buffer_end = psVar17->buffer_start + 1;
        psVar17->buffer_start[0] = '\0';
      }
      else {
        psVar17->img_buffer = psVar31;
        psVar17->img_buffer_end = psVar31 + iVar11;
      }
      psVar31 = psVar17->img_buffer;
    }
    psVar17->img_buffer = psVar31 + 1;
  } while (*psVar31 != 0xff);
  psVar17 = psVar15->s;
  psVar31 = psVar17->img_buffer;
  if (psVar31 < psVar17->img_buffer_end) {
LAB_001c885f:
    psVar17->img_buffer = psVar31 + 1;
    sVar8 = *psVar31;
  }
  else {
    if (psVar17->read_from_callbacks != 0) {
      psVar31 = psVar17->buffer_start;
      iVar11 = (*(psVar17->io).read)(psVar17->io_user_data,(char *)psVar31,psVar17->buflen);
      if (iVar11 == 0) {
        psVar17->read_from_callbacks = 0;
        psVar17->img_buffer = psVar31;
        psVar17->img_buffer_end = psVar17->buffer_start + 1;
        psVar17->buffer_start[0] = '\0';
      }
      else {
        psVar17->img_buffer = psVar31;
        psVar17->img_buffer_end = psVar31 + iVar11;
      }
      psVar31 = psVar17->img_buffer;
      goto LAB_001c885f;
    }
    sVar8 = '\0';
  }
  psVar15->marker = sVar8;
LAB_001c8734:
  bVar9 = stbi__get_marker(psVar15);
  goto LAB_001c727e;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}